

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::W1(ByteCodeWriter *this,OpCode op,ushort C1)

{
  code *pcVar1;
  OpLayoutW1 op_00;
  bool bVar2;
  undefined4 *puVar3;
  ushort local_1a;
  OpLayoutType local_18;
  ushort local_14;
  OpLayoutW1 data;
  ushort C1_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_14 = C1;
  data.C1 = op;
  CheckOpen(this);
  op_00.C1 = data.C1;
  OpLayoutType::OpLayoutType(&local_18,W1);
  CheckOp(this,op_00.C1,local_18);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(data.C1);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x972,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_1a = local_14;
  Data::Encode(&this->m_byteCodeData,data.C1,&local_1a,2,this);
  return;
}

Assistant:

void ByteCodeWriter::W1(OpCode op, ushort C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::W1);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));

        OpLayoutW1 data;
        data.C1 = C1;
        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }